

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O1

int main(void)

{
  peer_udp_broadcast_discovery();
  peer_udp_multicast_discovery();
  peer_change_user_data();
  peer_disappear();
  peer_V0_V1_discover();
  return 0;
}

Assistant:

int main() {
  peer_udp_broadcast_discovery();
  peer_udp_multicast_discovery();
  peer_change_user_data();
  peer_disappear();
  peer_V0_V1_discover();
  return 0;
}